

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_compress2
              (uchar *pDest,lzham_z_ulong *pDest_len,uchar *pSource,lzham_z_ulong source_len,
              int level)

{
  ulong in_RCX;
  lzham_z_streamp in_RDX;
  ulong *in_RSI;
  lzham_z_stream stream;
  int status;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ulong local_78;
  int in_stack_ffffffffffffff94;
  lzham_z_streamp in_stack_ffffffffffffff98;
  int local_4;
  
  memset(&stack0xffffffffffffff60,0,0x70);
  if ((in_RCX | *in_RSI) < 0x100000000) {
    local_4 = lzham_lib_z_deflateInit(in_RDX,in_stack_ffffffffffffff5c);
    if (local_4 == 0) {
      local_4 = lzham_lib_z_deflate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      if (local_4 == 1) {
        *in_RSI = local_78;
        local_4 = lzham_lib_z_deflateEnd
                            ((lzham_z_streamp)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else {
        lzham_lib_z_deflateEnd
                  ((lzham_z_streamp)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if (local_4 == 0) {
          local_4 = -5;
        }
      }
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int lzham_lib_z_compress2(unsigned char *pDest, lzham_z_ulong *pDest_len, const unsigned char *pSource, lzham_z_ulong source_len, int level)
   {
      int status;
      lzham_z_stream stream;
      memset(&stream, 0, sizeof(stream));

      // In case lzham_z_ulong is 64-bits (argh I hate longs).
      if ((source_len | *pDest_len) > 0xFFFFFFFFU)
      {
         LZHAM_LOG_ERROR(6042);
         return LZHAM_Z_PARAM_ERROR;
      }

      stream.next_in = pSource;
      stream.avail_in = (uint)source_len;
      stream.next_out = pDest;
      stream.avail_out = (uint)*pDest_len;

      status = lzham_lib_z_deflateInit(&stream, level);
      if (status != LZHAM_Z_OK)
      {
         LZHAM_LOG_ERROR(6043);
         return status;
      }

      status = lzham_lib_z_deflate(&stream, LZHAM_Z_FINISH);
      if (status != LZHAM_Z_STREAM_END)
      {
         lzham_lib_z_deflateEnd(&stream);
         return (status == LZHAM_Z_OK) ? LZHAM_Z_BUF_ERROR : status;
      }

      *pDest_len = stream.total_out;
      return lzham_lib_z_deflateEnd(&stream);
   }